

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

int lua_resetthread(lua_State *L)

{
  int iVar1;
  
  L->nCcalls = 0;
  iVar1 = luaE_resetthread(L,(uint)L->status);
  return iVar1;
}

Assistant:

LUA_API int lua_closethread (lua_State *L, lua_State *from) {
  int status;
  lua_lock(L);
  L->nCcalls = (from) ? getCcalls(from) : 0;
  status = luaE_resetthread(L, L->status);
  lua_unlock(L);
  return status;
}